

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

_Bool cf_h2_is_alive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  cf_h2_ctx *ctx;
  Curl_easy *pCVar1;
  Curl_cfilter *pCVar2;
  _Bool _Var3;
  byte bVar4;
  int iVar5;
  undefined8 in_RAX;
  ssize_t sVar6;
  CURLcode local_34;
  
  local_34 = (CURLcode)((ulong)in_RAX >> 0x20);
  ctx = (cf_h2_ctx *)cf->ctx;
  pCVar1 = (ctx->call_data).data;
  (ctx->call_data).data = data;
  if (ctx->h2 != (nghttp2_session *)0x0) {
    *input_pending = false;
    pCVar2 = cf->next;
    if (pCVar2 != (Curl_cfilter *)0x0) {
      _Var3 = (*pCVar2->cft->is_alive)(pCVar2,data,input_pending);
      if (_Var3) {
        bVar4 = 1;
        if (*input_pending != true) goto LAB_006a0434;
        *input_pending = false;
        sVar6 = Curl_bufq_slurp(&ctx->inbufq,nw_in_reader,cf,&local_34);
        if (sVar6 == -1) {
          bVar4 = local_34 == CURLE_AGAIN;
          goto LAB_006a0434;
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"%zd bytes stray data read before trying h2 connection",sVar6);
        }
        iVar5 = h2_process_pending_input(cf,data,&local_34);
        if (-1 < iVar5) {
          iVar5 = should_close_session(ctx);
          bVar4 = (byte)iVar5 ^ 1;
          goto LAB_006a0434;
        }
      }
    }
  }
  bVar4 = 0;
LAB_006a0434:
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"conn alive -> %d, input_pending=%d",(ulong)(bVar4 & 1),
                      (ulong)*input_pending);
  }
  *(Curl_easy **)((long)cf->ctx + 0x10) = pCVar1;
  return SUB41(bVar4 & 1,0);
}

Assistant:

static bool cf_h2_is_alive(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           bool *input_pending)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  CURLcode result;
  struct cf_call_data save;

  CF_DATA_SAVE(save, cf, data);
  result = (ctx && ctx->h2 && http2_connisalive(cf, data, input_pending));
  CURL_TRC_CF(data, cf, "conn alive -> %d, input_pending=%d",
              result, *input_pending);
  CF_DATA_RESTORE(cf, save);
  return result;
}